

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

void __thiscall QLCDNumber::paintEvent(QLCDNumber *this,QPaintEvent *param_1)

{
  QLCDNumberPrivate *this_00;
  QBitArray *newPoints;
  long in_FS_OFFSET;
  QPainter p;
  QPointF local_40;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  local_40.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_40,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,(QPainter *)&local_40);
  QPainter::setRenderHint((RenderHint)&local_40,true);
  if ((this_00->field_0x288 & 0x10) != 0) {
    local_40.yp = 0.5;
    uStack_30 = 0x3fe0000000000000;
    QPainter::translate(&local_40);
  }
  if ((this_00->field_0x288 & 4) == 0) {
    newPoints = (QBitArray *)0x0;
  }
  else {
    newPoints = &this_00->points;
  }
  QLCDNumberPrivate::drawString(this_00,&this_00->digitStr,(QPainter *)&local_40,newPoints,false);
  QPainter::~QPainter((QPainter *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLCDNumber::paintEvent(QPaintEvent *)
{
    Q_D(QLCDNumber);
    QPainter p(this);
    drawFrame(&p);
    p.setRenderHint(QPainter::Antialiasing);
    if (d->shadow)
        p.translate(0.5, 0.5);

    if (d->smallPoint)
        d->drawString(d->digitStr, p, &d->points, false);
    else
        d->drawString(d->digitStr, p, nullptr, false);
}